

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGradientDescent.hpp
# Opt level: O2

void __thiscall
TasOptimization::GradientDescentState::setX
          (GradientDescentState *this,vector<double,_std::allocator<double>_> *x_new)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GradientDescentState::setCandidate",&local_51);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"candidate point",&local_52);
  checkVarSize(&local_30,&local_50,
               (int)((ulong)((long)(x_new->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(x_new->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3),
               (int)((ulong)((long)(this->x).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->x).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3));
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::vector<double,_std::allocator<double>_>::operator=(&this->x,x_new);
  return;
}

Assistant:

inline void setX(const std::vector<double> &x_new) {
        checkVarSize("GradientDescentState::setCandidate", "candidate point", x_new.size(), x.size());
        x = x_new;
    }